

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::Compare<float>
          (ClearTest *this,GLfloat *data,GLfloat *reference,GLsizei count)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  if (count < 1) {
    return true;
  }
  fVar3 = *data - *reference;
  fVar4 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar4 = fVar3;
  }
  if (1e-05 < fVar4) {
    return false;
  }
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if ((uint)count == uVar2) break;
    fVar3 = data[uVar2] - reference[uVar2];
    fVar4 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar4 = fVar3;
    }
    uVar1 = uVar2 + 1;
  } while (fVar4 <= 1e-05);
  return (uint)count <= uVar2;
}

Assistant:

bool ClearTest::Compare<glw::GLfloat>(const glw::GLfloat* data, const glw::GLfloat* reference, const glw::GLsizei count)
{
	for (glw::GLsizei i = 0; i < count; ++i)
	{
		if (de::abs(data[i] - reference[i]) > 0.00001 /* Precision. */)
		{
			return false;
		}
	}
	return true;
}